

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullTypeHandler.cpp
# Opt level: O0

DictionaryTypeHandler * __thiscall
Js::NullTypeHandlerBase::ConvertToDictionaryType(NullTypeHandlerBase *this,DynamicObject *instance)

{
  DictionaryTypeHandlerBase<unsigned_short> *pDVar1;
  ScriptContext *pSVar2;
  DictionaryTypeHandler *newTypeHandler;
  DynamicObject *instance_local;
  NullTypeHandlerBase *this_local;
  
  pDVar1 = ConvertToTypeHandler<Js::DictionaryTypeHandlerBase<unsigned_short>>(this,instance);
  pSVar2 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  pSVar2->convertNullToDictionaryCount = pSVar2->convertNullToDictionaryCount + 1;
  return pDVar1;
}

Assistant:

DictionaryTypeHandler * NullTypeHandlerBase::ConvertToDictionaryType(DynamicObject * instance)
    {
        DictionaryTypeHandler* newTypeHandler = ConvertToTypeHandler<DictionaryTypeHandler>(instance);

#ifdef PROFILE_TYPES
        instance->GetScriptContext()->convertNullToDictionaryCount++;
#endif
        return newTypeHandler;
    }